

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
::fastAccessDx(FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
               *this,int i)

{
  value_type *in_RDI;
  value_type *this_00;
  Fad<double> *in_stack_ffffffffffffffa0;
  Fad<double> *in_stack_ffffffffffffffa8;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *in_stack_ffffffffffffffb8;
  Fad<double> *in_stack_ffffffffffffffc0;
  
  this_00 = in_RDI;
  FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::fastAccessDx
            ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)in_RDI,
             (int)((ulong)in_RDI >> 0x20));
  FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>
  ::fastAccessDx((FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>
                  *)this_00,(int)((ulong)in_RDI >> 0x20));
  operator+<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Fad<double>::Fad<FadBinaryAdd<Fad<double>,Fad<double>>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_RDI);
  Fad<double>::~Fad(in_RDI);
  Fad<double>::~Fad(in_RDI);
  return this_00;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}